

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::Clear(ItemSimilarityRecommender *this)

{
  InternalMetadata *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->iteminputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->numrecommendationsinputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemrestrictioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->itemexclusioninputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemlistoutputfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
            (&this->recommendeditemscoreoutputfeaturename_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  uVar1 = uVar1 & 1;
  puVar3 = puVar2;
  if (uVar1 != 0) {
    puVar3 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar3 == (undefined8 *)0x0) &&
     (this_01 = this->itemstringids_, this_01 != (StringVector *)0x0)) {
    StringVector::~StringVector(this_01);
    operator_delete(this_01,0x30);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->itemstringids_ = (StringVector *)0x0;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_02 = this->itemint64ids_, this_02 != (Int64Vector *)0x0)) {
    Int64Vector::~Int64Vector(this_02);
    operator_delete(this_02,0x28);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->itemint64ids_ = (Int64Vector *)0x0;
  if (uVar1 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ItemSimilarityRecommender)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  itemitemsimilarities_.Clear();
  iteminputfeaturename_.ClearToEmpty();
  numrecommendationsinputfeaturename_.ClearToEmpty();
  itemrestrictioninputfeaturename_.ClearToEmpty();
  itemexclusioninputfeaturename_.ClearToEmpty();
  recommendeditemlistoutputfeaturename_.ClearToEmpty();
  recommendeditemscoreoutputfeaturename_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && itemstringids_ != nullptr) {
    delete itemstringids_;
  }
  itemstringids_ = nullptr;
  if (GetArenaForAllocation() == nullptr && itemint64ids_ != nullptr) {
    delete itemint64ids_;
  }
  itemint64ids_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}